

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_qemu_st(TCGContext_conflict9 *s,TCGArg *args,_Bool is64)

{
  TCGArg TVar1;
  TCGArg TVar2;
  TCGMemOpIdx oi_00;
  MemOp opc_00;
  uint mem_index_00;
  tcg_insn_unit *local_58;
  tcg_insn_unit *label_ptr [2];
  int mem_index;
  MemOp opc;
  TCGMemOpIdx oi;
  TCGReg addrhi;
  TCGReg addrlo;
  TCGReg datahi;
  TCGReg datalo;
  _Bool is64_local;
  TCGArg *args_local;
  TCGContext_conflict9 *s_local;
  
  TVar1 = *args;
  TVar2 = args[1];
  oi_00 = (TCGMemOpIdx)args[2];
  opc_00 = get_memop(oi_00);
  mem_index_00 = get_mmuidx(oi_00);
  tcg_out_tlb_load(s,(TCGReg)TVar2,TCG_REG_EAX,mem_index_00,opc_00,&local_58,4);
  tcg_out_qemu_st_direct(s,(TCGReg)TVar1,TCG_REG_EAX,TCG_REG_ESI,-1,0,0,opc_00);
  add_qemu_ldst_label(s,false,is64,oi_00,(TCGReg)TVar1,TCG_REG_EAX,(TCGReg)TVar2,TCG_REG_EAX,
                      s->code_ptr,&local_58);
  return;
}

Assistant:

static void tcg_out_qemu_st(TCGContext *s, const TCGArg *args, bool is64)
{
    TCGReg datalo, datahi, addrlo;
    TCGReg addrhi QEMU_UNUSED_VAR;
    TCGMemOpIdx oi;
    MemOp opc;
    int mem_index;
    tcg_insn_unit *label_ptr[2];

    datalo = *args++;
    datahi = (TCG_TARGET_REG_BITS == 32 && is64 ? *args++ : 0);
    addrlo = *args++;
    addrhi = (TARGET_LONG_BITS > TCG_TARGET_REG_BITS ? *args++ : 0);
    oi = *args++;
    opc = get_memop(oi);

    mem_index = get_mmuidx(oi);

    tcg_out_tlb_load(s, addrlo, addrhi, mem_index, opc,
                     label_ptr, offsetof(CPUTLBEntry, addr_write));

    /* TLB Hit.  */
    tcg_out_qemu_st_direct(s, datalo, datahi, TCG_REG_L1, -1, 0, 0, opc);

    /* Record the current context of a store into ldst label */
    add_qemu_ldst_label(s, false, is64, oi, datalo, datahi, addrlo, addrhi,
                        s->code_ptr, label_ptr);
}